

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O1

void __thiscall
mocker::DominatorTree::buildImmediateDominator(DominatorTree *this,FunctionModule *func)

{
  bool bVar1;
  _List_node_base *u;
  _List_node_base *v;
  int iVar2;
  mapped_type *pmVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  size_t node;
  mapped_type *__range2;
  _List_node_base *local_78;
  _List_node_base *local_70;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  _List_node_base *local_58;
  mapped_type *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_58 = (func->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  local_70 = (_List_node_base *)&func->bbs;
  if (local_58 != local_70) {
    local_60 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->dominators;
    local_68 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->immediateDominator;
    do {
      local_78 = local_58[1]._M_next;
      bVar1 = this->reverse;
      if (bVar1 == false) {
        if (local_78 != local_70->_M_next[1]._M_next) {
          bVar6 = false;
          goto LAB_0015579f;
        }
LAB_00155883:
        pmVar3 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_68,(key_type *)&local_78);
        *pmVar3 = 0xffffffffffffffff;
      }
      else {
        ir::BasicBlock::getSuccessors(&local_48,(BasicBlock *)(local_58 + 1));
        bVar6 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
LAB_0015579f:
        if ((bVar1 != false) &&
           (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar6) goto LAB_00155883;
        local_50 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at(local_60,(key_type *)&local_78);
        for (p_Var5 = (local_50->_M_h)._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
            p_Var5 = p_Var5->_M_nxt) {
          u = (_List_node_base *)p_Var5[1]._M_nxt;
          iVar2 = 5;
          if (u != local_78) {
            p_Var4 = (local_50->_M_h)._M_before_begin._M_nxt;
            if (p_Var4 != (_Hash_node_base *)0x0) {
              bVar1 = true;
              do {
                v = (_List_node_base *)p_Var4[1]._M_nxt;
                iVar2 = 7;
                if (v != local_78) {
                  if (u == v) {
                    bVar6 = false;
                  }
                  else {
                    bVar6 = isDominating(this,(size_t)u,(size_t)v);
                  }
                  iVar2 = 0;
                  if (bVar6 != false) {
                    bVar1 = false;
                    iVar2 = 6;
                  }
                }
              } while (((iVar2 == 7) || (iVar2 == 0)) &&
                      (p_Var4 = p_Var4->_M_nxt, p_Var4 != (_Hash_node_base *)0x0));
              iVar2 = 0;
              if (!bVar1) goto LAB_00155863;
            }
            pmVar3 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_68,(key_type *)&local_78);
            *pmVar3 = (mapped_type)u;
            iVar2 = 4;
          }
LAB_00155863:
          if ((iVar2 != 5) && (iVar2 != 0)) break;
        }
      }
      local_58 = local_58->_M_next;
    } while (local_58 != local_70);
  }
  return;
}

Assistant:

void DominatorTree::buildImmediateDominator(const ir::FunctionModule &func) {
  // For a faster algorithm, see [Lengauer, Tarjan, 1979]

  for (const auto &bb : func.getBBs()) {
    auto node = bb.getLabelID();
    if (!reverse && node == func.getFirstBBLabel()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }
    if (reverse && bb.getSuccessors().empty()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }

    const auto &Dominators = dominators.at(node);
    for (auto dominator : Dominators) {
      if (dominator == node) // is not strict
        continue;
      bool flag = true;
      for (auto otherDominator : Dominators) {
        if (otherDominator == node)
          continue;
        if (isStrictlyDominating(dominator, otherDominator)) {
          flag = false;
          break;
        }
      }
      if (flag) {
        immediateDominator[node] = dominator;
        break;
      }
    }
  }
}